

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

OpenCLKernel * __thiscall
ocl::KernelSource::getKernel(KernelSource *this,shared_ptr<ocl::OpenCLEngine> *cl,bool printLog)

{
  undefined8 *puVar1;
  __suseconds_t *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  pointer pcVar5;
  cl_platform_id platform;
  cl_device_id device_00;
  double dVar6;
  shared_ptr<ocl::OpenCLEngine> *psVar7;
  int iVar8;
  _Rb_tree_header *p_Var9;
  VersionedBinary *pVVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar11;
  long *plVar12;
  ostream *poVar13;
  pointer __dest;
  undefined8 *puVar14;
  mapped_type *pp_Var15;
  OpenCLKernel *this_00;
  mapped_type *ppOVar16;
  const_iterator cVar17;
  ocl_exception *this_01;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong *puVar21;
  undefined7 in_register_00000011;
  byte bVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [8];
  cl_int cVar26;
  size_t __n;
  undefined4 uVar27;
  cl_int ciErrNum;
  cl_device_id device;
  string binaries_string;
  string binaries_to_load_filename;
  cl_int binary_status_1;
  cl_int binary_status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries_1;
  ifstream program_binaries_file;
  cl_int local_55c;
  _Base_ptr local_558;
  undefined4 local_54c;
  shared_ptr<ocl::OpenCLEngine> *local_548;
  KernelSource *local_540;
  undefined1 local_538 [16];
  unsigned_long *puStack_528;
  timer local_518;
  undefined1 *local_4d8;
  long local_4d0;
  undefined1 local_4c8 [16];
  undefined8 *local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  _cl_device_id *local_498;
  long local_490;
  _cl_device_id local_488 [16];
  undefined8 *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_438;
  ulong *local_418;
  long local_410;
  ulong local_408 [2];
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  long lStack_3e0;
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8;
  long lStack_3c0;
  Mutex *local_3b8;
  char local_3b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a8;
  char *local_390 [2];
  char local_380 [16];
  string local_370;
  string local_350;
  string local_330;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_310;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [13];
  char acStack_150 [16];
  ios_base local_140 [272];
  
  peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var19 = *(_Base_ptr *)
             ((long)&(peVar3->kernels_)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var19 != (_Base_ptr)0x0) {
    iVar8 = this->id_;
    p_Var9 = &(peVar3->kernels_)._M_t._M_impl.super__Rb_tree_header;
    p_Var18 = &p_Var9->_M_header;
    do {
      if (iVar8 <= (int)p_Var19[1]._M_color) {
        p_Var18 = p_Var19;
      }
      p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < iVar8];
    } while (p_Var19 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var18 != p_Var9) && ((int)p_Var18[1]._M_color <= iVar8)) &&
       ((OpenCLKernel *)p_Var18[1]._M_parent != (OpenCLKernel *)0x0)) {
      return (OpenCLKernel *)p_Var18[1]._M_parent;
    }
  }
  p_Var19 = *(_Base_ptr *)
             ((long)&(peVar3->programs_)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var19 != (_Base_ptr)0x0) {
    iVar8 = ((this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_;
    p_Var9 = &(peVar3->programs_)._M_t._M_impl.super__Rb_tree_header;
    p_Var18 = &p_Var9->_M_header;
    do {
      if (iVar8 <= (int)p_Var19[1]._M_color) {
        p_Var18 = p_Var19;
      }
      p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < iVar8];
    } while (p_Var19 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var18 != p_Var9) && ((int)p_Var18[1]._M_color <= iVar8)) &&
       (local_558 = p_Var18[1]._M_parent, local_558 != (_Base_ptr)0x0)) goto LAB_001204d1;
  }
  local_54c = (undefined4)CONCAT71(in_register_00000011,printLog);
  local_3b8 = (Mutex *)cached_kernels_mutex;
  Mutex::lock((Mutex *)cached_kernels_mutex);
  local_3b0 = '\x01';
  pVVar10 = ProgramBinaries::getBinary
                      ((this->program_).
                       super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       cl);
  peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar11 = getCachedBinary(((this->program_).
                             super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_,peVar3->platform_id_,peVar3->device_id_);
  local_55c = 0;
  peVar4 = (this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_390[0] = local_380;
  pcVar5 = (peVar4->defines_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_390,pcVar5,pcVar5 + (peVar4->defines_)._M_string_length);
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8 = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8);
  local_548 = cl;
  local_540 = this;
  if (local_4d0 == 0) {
    if (pvVar11 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) goto LAB_0011f8ea;
    if (pVVar10->device_address_bits_ == 0) {
      local_238 = (undefined1  [8])0x0;
      paStack_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_228[0]._M_allocated_capacity = 0;
      local_518.start_.tv_usec = 0;
      local_518.counter_ = 0.0;
      local_518.start_.tv_sec = 0;
      local_538._0_8_ = pVVar10->data_;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_238,
                 (value_type *)local_538);
      local_538._0_8_ = pVVar10->size_;
      if (local_518.start_.tv_sec == local_518.start_.tv_usec) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_518,
                   (iterator)local_518.start_.tv_sec,(unsigned_long *)local_538);
      }
      else {
        *(undefined8 *)local_518.start_.tv_sec = local_538._0_8_;
        local_518.start_.tv_sec = local_518.start_.tv_sec + 8;
      }
      uVar27 = local_54c;
      local_558 = (_Base_ptr)
                  clCreateProgramWithSource
                            (((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->context_,
                             (cl_uint)((ulong)((long)paStack_230 - (long)local_238) >> 3),
                             (char **)local_238,(size_t *)local_518.counter_,&local_55c);
      cVar26 = local_55c;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
      reportError(cVar26,0x22c,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      this = local_540;
      auVar25 = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518.counter_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_518.counter_);
        auVar25 = local_238;
      }
    }
    else {
      local_518.counter_ = 0.0;
      local_518.start_.tv_sec = 0;
      local_518.start_.tv_usec = 0;
      puStack_528 = (unsigned_long *)0x0;
      local_538._0_8_ = (cl_device_id)0x0;
      local_538._8_8_ = (unsigned_long *)0x0;
      local_238 = (undefined1  [8])pVVar10->data_;
      std::vector<unsigned_char_const*,std::allocator<unsigned_char_const*>>::
      _M_realloc_insert<unsigned_char_const*>
                ((vector<unsigned_char_const*,std::allocator<unsigned_char_const*>> *)&local_518,
                 (iterator)0x0,(uchar **)local_238);
      local_238 = (undefined1  [8])pVVar10->size_;
      if ((unsigned_long *)local_538._8_8_ == puStack_528) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_538,
                   (iterator)local_538._8_8_,(unsigned_long *)local_238);
      }
      else {
        *(undefined1 (*) [8])local_538._8_8_ = local_238;
        local_538._8_8_ = local_538._8_8_ + 8;
      }
      peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_498 = peVar3->device_id_;
      local_558 = (_Base_ptr)
                  clCreateProgramWithBinary
                            (peVar3->context_,1,&local_498,(size_t *)local_538._0_8_,
                             (uchar **)local_518.counter_,(cl_int *)&local_4b8,&local_55c);
      cVar26 = (cl_int)local_4b8;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
      reportError(cVar26,0x238,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      cVar26 = local_55c;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
      reportError(cVar26,0x239,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_238 = (undefined1  [8])local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"cl_khr_spir","");
      cVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(peVar3->device_info_).extensions._M_t,(key_type *)local_238);
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238);
      }
      uVar27 = local_54c;
      if (cVar17._M_node ==
          &(peVar3->device_info_).extensions._M_t._M_impl.super__Rb_tree_header._M_header) {
        this_01 = (ocl_exception *)__cxa_allocate_exception(0x10);
        ocl_exception::ocl_exception(this_01,"Device does not support SPIR!");
        __cxa_throw(this_01,&ocl_exception::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::append((char *)local_390);
      this = local_540;
      auVar25 = (undefined1  [8])local_518.counter_;
      if ((cl_device_id)local_538._0_8_ != (cl_device_id)0x0) {
        operator_delete((void *)local_538._0_8_);
        auVar25 = (undefined1  [8])local_518.counter_;
      }
    }
    if (auVar25 != (undefined1  [8])0x0) {
      operator_delete((void *)auVar25);
    }
    bVar22 = 1;
  }
  else {
    std::ifstream::ifstream(local_238);
    std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_4d8);
    p_Var2 = &local_518.start_.tv_usec;
    local_518.counter_ = (double)p_Var2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_518,
               *(undefined8 *)(acStack_150 + (long)*(pointer)((long)local_238 + -0x18)),0xffffffff,0
               ,0xffffffff);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_538,
               local_518.start_.tv_sec,(allocator_type *)&local_498);
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_538._0_8_;
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_538._8_8_;
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puStack_528;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518.start_.tv_sec !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      do {
        *(_cl_device_id *)(local_538._0_8_ + (long)paVar20) =
             *(_cl_device_id *)((long)local_518.counter_ + (long)paVar20);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar20->_M_local_buf + 1);
      } while (paVar20 < (ulong)local_518.start_.tv_sec);
    }
    std::ifstream::close();
    if ((__suseconds_t *)local_518.counter_ != p_Var2) {
      operator_delete((void *)local_518.counter_);
    }
    std::ifstream::~ifstream(local_238);
    pvVar11 = &local_3a8;
LAB_0011f8ea:
    local_238 = (undefined1  [8])0x0;
    paStack_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_228[0]._M_allocated_capacity = 0;
    local_518.start_.tv_usec = 0;
    local_518.counter_ = 0.0;
    local_518.start_.tv_sec = 0;
    local_538._0_8_ =
         (pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    std::vector<unsigned_char_const*,std::allocator<unsigned_char_const*>>::
    _M_realloc_insert<unsigned_char_const*>
              ((vector<unsigned_char_const*,std::allocator<unsigned_char_const*>> *)local_238,
               (iterator)0x0,(uchar **)local_538);
    uVar27 = local_54c;
    local_538._0_8_ =
         (pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)(pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start;
    if (local_518.start_.tv_sec == local_518.start_.tv_usec) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_518,
                 (iterator)local_518.start_.tv_sec,(unsigned_long *)local_538);
    }
    else {
      *(undefined8 *)local_518.start_.tv_sec = local_538._0_8_;
      local_518.start_.tv_sec = local_518.start_.tv_sec + 8;
    }
    peVar3 = (cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_538._0_8_ = peVar3->device_id_;
    local_558 = (_Base_ptr)
                clCreateProgramWithBinary
                          (peVar3->context_,1,(cl_device_id *)local_538,(size_t *)local_518.counter_
                           ,(uchar **)local_238,(cl_int *)&local_498,&local_55c);
    cVar26 = (cl_int)local_498;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
    reportError(cVar26,0x222,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    cVar26 = local_55c;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
    reportError(cVar26,0x223,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    this = local_540;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518.counter_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_518.counter_);
    }
    if (local_238 != (undefined1  [8])0x0) {
      operator_delete((void *)local_238);
    }
    bVar22 = 0;
  }
  to_string<unsigned_long>
            ((string *)&local_518,
             ((local_548->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->wavefront_size_);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,0x13061d);
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 == paVar20) {
    local_228[0]._0_8_ = paVar20->_M_allocated_capacity;
    local_228[0]._8_8_ = plVar12[3];
    local_238 = (undefined1  [8])local_228;
  }
  else {
    local_228[0]._0_8_ = paVar20->_M_allocated_capacity;
    local_238 = (undefined1  [8])*plVar12;
  }
  paStack_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar12[1];
  *plVar12 = (long)paVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_390,(ulong)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238);
  }
  if ((__suseconds_t *)local_518.counter_ != &local_518.start_.tv_usec) {
    operator_delete((void *)local_518.counter_);
  }
  timer::timer(&local_518,false);
  if (local_518.is_running_ == 0) {
    gettimeofday((timeval *)local_238,(__timezone_ptr_t)0x0);
    local_518.start_.tv_sec = (__time_t)local_238;
    local_518.start_.tv_usec = (__suseconds_t)paStack_230;
    local_518.is_running_ = 1;
  }
  if (((bVar22 & (byte)uVar27) == 1) &&
     (iVar8 = std::__cxx11::string::compare
                        ((char *)&((this->program_).
                                   super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->program_name_), iVar8 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Building kernels for ",0x15);
    peVar3 = (local_548->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(peVar3->device_info_).device_name._M_dataplus._M_p,
                         (peVar3->device_info_).device_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"... ",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  local_55c = clBuildProgram((cl_program)local_558,0,(cl_device_id *)0x0,local_390[0],
                             (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
  if (bVar22 == 1 && local_55c == 0) {
    iVar8 = std::__cxx11::string::compare
                      ((char *)&((this->program_).
                                 super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->program_name_);
    if ((byte)uVar27 == 1 && iVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Kernels compilation done in ",0x1c);
      dVar6 = timer::elapsed(&local_518);
      poVar13 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," seconds",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    getProgramBinaries((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,
                       (cl_program)local_558);
    iVar8 = ((this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_;
    peVar3 = (local_548->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    platform = peVar3->platform_id_;
    device_00 = peVar3->device_id_;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar23 = (long)paStack_230 - (long)local_238;
    if (uVar23 == 0) {
      __dest = (pointer)0x0;
      __n = 0;
    }
    else {
      if ((long)uVar23 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer)operator_new(uVar23);
      __n = (long)paStack_230 - (long)local_238;
    }
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __dest + uVar23;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = __dest;
    if ((undefined1  [8])paStack_230 != local_238) {
      local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest;
      memmove(__dest,(void *)local_238,__n);
    }
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest + __n;
    setCachedBinary(iVar8,platform,device_00,&local_438);
    this = local_540;
    uVar27 = local_54c;
    if (local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_238 != (undefined1  [8])0x0) {
      operator_delete((void *)local_238);
    }
  }
  cVar26 = 0;
  if ((local_55c == 0 & ((byte)uVar27 ^ 1)) == 0) {
    oclPrintBuildLog((cl_program)local_558);
    local_538._0_8_ = (cl_device_id)&puStack_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"");
    psVar7 = local_548;
    if ((unsigned_long *)local_538._8_8_ != (unsigned_long *)0x0) {
      getProgramBinaries(&local_310,(cl_program)local_558);
      local_498 = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_498,
                 local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      std::ofstream::ofstream(local_238);
      local_418 = local_408;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_418,local_538._0_8_,
                 (cl_device_id)(local_538._8_8_ + local_538._0_8_));
      std::__cxx11::string::append((char *)&local_418);
      to_string<_cl_platform_id*>
                (&local_330,
                 ((psVar7->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->platform_id_);
      uVar23 = 0xf;
      if (local_418 != local_408) {
        uVar23 = local_408[0];
      }
      if (uVar23 < local_330._M_string_length + local_410) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          uVar24 = local_330.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_330._M_string_length + local_410) goto LAB_0011fef1;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_418);
      }
      else {
LAB_0011fef1:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_418,(ulong)local_330._M_dataplus._M_p);
      }
      local_478 = &local_468;
      puVar1 = puVar14 + 2;
      if ((undefined8 *)*puVar14 == puVar1) {
        local_468 = *puVar1;
        uStack_460 = puVar14[3];
      }
      else {
        local_468 = *puVar1;
        local_478 = (undefined8 *)*puVar14;
      }
      local_470 = puVar14[1];
      *puVar14 = puVar1;
      puVar14[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_478);
      puVar21 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar21) {
        local_3e8 = *puVar21;
        lStack_3e0 = plVar12[3];
        local_3f8 = &local_3e8;
      }
      else {
        local_3e8 = *puVar21;
        local_3f8 = (ulong *)*plVar12;
      }
      local_3f0 = plVar12[1];
      *plVar12 = (long)puVar21;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      to_string<_cl_device_id*>
                (&local_350,
                 ((local_548->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->device_id_);
      uVar23 = 0xf;
      if (local_3f8 != &local_3e8) {
        uVar23 = local_3e8;
      }
      if (uVar23 < local_350._M_string_length + local_3f0) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          uVar24 = local_350.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_350._M_string_length + local_3f0) goto LAB_001200a5;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_3f8);
      }
      else {
LAB_001200a5:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3f8,(ulong)local_350._M_dataplus._M_p);
      }
      local_458 = &local_448;
      puVar1 = puVar14 + 2;
      if ((undefined8 *)*puVar14 == puVar1) {
        local_448 = *puVar1;
        uStack_440 = puVar14[3];
      }
      else {
        local_448 = *puVar1;
        local_458 = (undefined8 *)*puVar14;
      }
      local_450 = puVar14[1];
      *puVar14 = puVar1;
      puVar14[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_458);
      puVar21 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar21) {
        local_3c8 = *puVar21;
        lStack_3c0 = plVar12[3];
        local_3d8 = &local_3c8;
      }
      else {
        local_3c8 = *puVar21;
        local_3d8 = (ulong *)*plVar12;
      }
      local_3d0 = plVar12[1];
      *plVar12 = (long)puVar21;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      to_string<int>(&local_370,
                     ((local_540->program_).
                      super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     id_);
      uVar23 = 0xf;
      if (local_3d8 != &local_3c8) {
        uVar23 = local_3c8;
      }
      if (uVar23 < local_370._M_string_length + local_3d0) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          uVar24 = local_370.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_370._M_string_length + local_3d0) goto LAB_001201ee;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,(ulong)local_3d8);
      }
      else {
LAB_001201ee:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3d8,(ulong)local_370._M_dataplus._M_p);
      }
      local_4b8 = &local_4a8;
      puVar1 = puVar14 + 2;
      if ((undefined8 *)*puVar14 == puVar1) {
        local_4a8 = *puVar1;
        uStack_4a0 = puVar14[3];
      }
      else {
        local_4a8 = *puVar1;
        local_4b8 = (undefined8 *)*puVar14;
      }
      local_4b0 = puVar14[1];
      *puVar14 = puVar1;
      puVar14[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::ofstream::open((string *)local_238,(_Ios_Openmode)&local_4b8);
      if (local_4b8 != &local_4a8) {
        operator_delete(local_4b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8);
      }
      if (local_458 != &local_448) {
        operator_delete(local_458);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8);
      }
      if (local_478 != &local_468) {
        operator_delete(local_478);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      if (local_418 != local_408) {
        operator_delete(local_418);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,(char *)local_498,local_490);
      std::ofstream::close();
      local_238 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_238 + (&_VTT->_M_allocated_capacity)[-3]) =
           ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&paStack_230);
      std::ios_base::~ios_base(local_140);
      if (local_498 != local_488) {
        operator_delete(local_498);
      }
      if (local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((cl_device_id)local_538._0_8_ != (cl_device_id)&puStack_528) {
      operator_delete((void *)local_538._0_8_);
    }
    this = local_540;
    cVar26 = 0;
    if (local_55c != 0) {
      clReleaseProgram((cl_program)local_558);
      local_558 = (_Base_ptr)0x0;
      cVar26 = local_55c;
    }
  }
  cl = local_548;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  reportError(cVar26,0x272,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  local_238._0_4_ =
       ((this->program_).super___shared_ptr<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->id_;
  pp_Var15 = std::
             map<int,__cl_program_*,_std::less<int>,_std::allocator<std::pair<const_int,__cl_program_*>_>_>
             ::operator[](&((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->programs_,(key_type *)local_238);
  *pp_Var15 = (mapped_type)local_558;
  if (local_518.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if ((cl_device_id)
      local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (cl_device_id)0x0) {
    operator_delete(local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0]);
  }
  if (local_3b0 == '\x01') {
    Mutex::unlock(local_3b8);
  }
LAB_001204d1:
  this_00 = (OpenCLKernel *)operator_new(0x30);
  (this_00->kernel_name_)._M_dataplus._M_p = (pointer)&(this_00->kernel_name_).field_2;
  (this_00->kernel_name_)._M_string_length = 0;
  (this_00->kernel_name_).field_2._M_local_buf[0] = '\0';
  this_00->kernel_ = (cl_kernel)0x0;
  this_00->work_group_size_ = 0;
  OpenCLKernel::create
            (this_00,(cl_program)local_558,(this->name_)._M_dataplus._M_p,(cl_device_id)0x0);
  ppOVar16 = std::
             map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
             ::operator[](&((cl->super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->kernels_,&this->id_);
  *ppOVar16 = this_00;
  return this_00;
}

Assistant:

OpenCLKernel *KernelSource::getKernel(const std::shared_ptr<OpenCLEngine> &cl, bool printLog)
{
	OpenCLKernel *kernel = cl->findKernel(id_);
	if (kernel)
		return kernel;

	cl_program program = cl->findProgram(program_->id());

	if (!program) {
		Lock lock(cached_kernels_mutex);

		bool verbose = printLog || OCL_VERBOSE_COMPILE_LOG;

		const VersionedBinary* binary = program_->getBinary(cl);
		const std::vector<unsigned char>* cachedCompiledBinary = getCachedBinary(program_->id(), cl->platform(), cl->device());

		cl_int ciErrNum = CL_SUCCESS;

		std::string options = program_->defines();

		std::vector<unsigned char> loaded_from_file_binaries;
		std::string binaries_to_load_filename = LOAD_KERNEL_BINARIES_FROM_FILE;

		if (!binaries_to_load_filename.empty()){
			std::ifstream program_binaries_file;
			program_binaries_file.open(binaries_to_load_filename);

			std::string binaries_string((std::istreambuf_iterator<char>(program_binaries_file)), std::istreambuf_iterator<char>());

			loaded_from_file_binaries = std::vector<unsigned char>(binaries_string.size());
			for (int i = 0; i < binaries_string.size(); ++i) {
				loaded_from_file_binaries[i] = (unsigned char) binaries_string[i];
			}
			cachedCompiledBinary = &loaded_from_file_binaries;

			program_binaries_file.close();
		}

		if (cachedCompiledBinary != NULL) {
			std::vector<const unsigned char *>	kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back(cachedCompiledBinary->data());
			kernel_sizes.push_back(cachedCompiledBinary->size());

			cl_device_id device = cl->device();
			cl_int binary_status;

			program = clCreateProgramWithBinary(cl->context(), 1, &device, &kernel_sizes[0], &kernel_ptrs[0], &binary_status, &ciErrNum);
			OCL_SAFE_CALL(binary_status);
			OCL_SAFE_CALL(ciErrNum);
		} else if (binary->deviceAddressBits() == 0) {
			std::vector<const char *>			kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back(binary->data());
			kernel_sizes.push_back(binary->size());

			program = clCreateProgramWithSource(cl->context(), kernel_ptrs.size(), &kernel_ptrs[0], &kernel_sizes[0], &ciErrNum);
			OCL_SAFE_CALL(ciErrNum);
		} else {
			std::vector<const unsigned char *>	kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back((unsigned char*) binary->data());
			kernel_sizes.push_back(binary->size());

			cl_device_id device = cl->device();
			cl_int binary_status;

			program = clCreateProgramWithBinary(cl->context(), 1, &device, &kernel_sizes[0], &kernel_ptrs[0], &binary_status, &ciErrNum);
			OCL_SAFE_CALL(binary_status);
			OCL_SAFE_CALL(ciErrNum);

			if (cl->deviceInfo().extensions.count("cl_khr_spir") == 0)
				throw ocl_exception("Device does not support SPIR!");

			options += " -x spir";
		}

		options += " -D WARP_SIZE=" + to_string(cl->wavefrontSize());

		timer tm;
		tm.start();

		if (cachedCompiledBinary == NULL && verbose) {
			if (program_->programName() == "") {
				std::cout << "Building kernels for " << cl->deviceName() << "... " << std::endl;
			}
//			else {
//				std::cout << "Building kernel " << program_->programName() << " for " << cl->deviceName() << "... " << std::endl;
//			}
		}

		ciErrNum = clBuildProgram(program, 0, NULL, options.c_str(), NULL, NULL);

		if (ciErrNum == CL_SUCCESS && cachedCompiledBinary == NULL) {
			if (program_->programName() == "" && verbose) {
				std::cout << "Kernels compilation done in " << tm.elapsed() << " seconds" << std::endl;
			}
//			else {
//				std::cout << "Kernel " << program_->programName() << " compilation done in " << tm.elapsed() << " seconds" << std::endl;
//			}

			std::vector<unsigned char> binaries = getProgramBinaries(program);
			setCachedBinary(program_->id(), cl->platform(), cl->device(), binaries);
		}

		if (ciErrNum != CL_SUCCESS || verbose) {
			ocl::oclPrintBuildLog(program);

			std::string binaries_filename = DUMP_KERNEL_BINARIES_TO_FILE;
			if (!binaries_filename.empty()) {
				std::vector<unsigned char> binaries = getProgramBinaries(program);
				std::string binaries_string((char*) binaries.data(), binaries.size());

				std::ofstream program_binaries_file;
				program_binaries_file.open(binaries_filename + "_platform" + to_string(cl->platform()) + "_device" + to_string(cl->device()) + "_program" + to_string(program_->id()));

				program_binaries_file << binaries_string;
				program_binaries_file.close();
			}
		}

		if (ciErrNum != CL_SUCCESS) {
			clReleaseProgram(program);
			program = 0;
		}

		OCL_SAFE_CALL(ciErrNum);
		cl->programs()[program_->id()] = program;
	}

	kernel = new OpenCLKernel;
	kernel->create(program, name_.c_str());

	cl->kernels()[id_] = kernel;

	return kernel;
}